

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

void putArray(Array a,Data c)

{
  size_t sVar1;
  element *peVar2;
  Array paVar3;
  
  peVar2 = (element *)malloc(0x10);
  peVar2->data = c;
  peVar2->next = (element *)0x0;
  sVar1 = a->length;
  paVar3 = a;
  if (sVar1 != 0) {
    paVar3 = (Array)&a->tail->next;
  }
  paVar3->head = peVar2;
  a->tail = peVar2;
  a->length = sVar1 + 1;
  return;
}

Assistant:

void putArray(Array a, Data c) {
    struct element *el = malloc(sizeof(struct element));
    el->data = c;
    el->next = NULL;

    if (a->length == 0) {
        a->head = el;
    } else {
        a->tail->next = el;
    }

    a->tail = el;
    a->length++;
}